

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::CheckCMP0037(cmMakefile *this,string *targetName,TargetType targetType)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  string local_1f8;
  string local_1d8;
  byte local_1a1;
  undefined1 local_1a0 [7];
  bool issueMessage;
  ostringstream e;
  MessageType local_28;
  MessageType messageType;
  TargetType targetType_local;
  string *targetName_local;
  cmMakefile *this_local;
  
  local_28 = AUTHOR_WARNING;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  local_1a1 = 0;
  PVar1 = GetPolicyStatus(this,CMP0037,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      if (targetType != INTERFACE_LIBRARY) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x25,id);
        poVar2 = std::operator<<((ostream *)local_1a0,(string *)&local_1d8);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_1d8);
        local_1a1 = 1;
      }
    }
    else if (PVar1 - NEW < 3) {
      local_1a1 = 1;
      local_28 = FATAL_ERROR;
    }
  }
  if ((local_1a1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"The target name \"");
    poVar2 = std::operator<<(poVar2,(string *)targetName);
    std::operator<<(poVar2,
                    "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                   );
    std::__cxx11::ostringstream::str();
    IssueMessage(this,local_28,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    if (local_28 == FATAL_ERROR) {
      this_local._7_1_ = false;
      goto LAB_00876e57;
    }
  }
  this_local._7_1_ = true;
LAB_00876e57:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::CheckCMP0037(std::string const& targetName,
                              cmStateEnums::TargetType targetType) const
{
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (this->GetPolicyStatus(cmPolicies::CMP0037)) {
    case cmPolicies::WARN:
      if (targetType != cmStateEnums::INTERFACE_LIBRARY) {
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName
      << "\" is reserved or not valid for certain "
         "CMake features, such as generator expressions, and may result "
         "in undefined behavior.";
    this->IssueMessage(messageType, e.str());

    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}